

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O1

void __thiscall
pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::InlinedVector
          (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *this,
          InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *other,
          polymorphic_allocator<float> *alloc)

{
  size_t sVar1;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar2;
  size_t sVar3;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar4;
  
  (this->alloc).memoryResource = alloc->memoryResource;
  this->ptr = (float *)0x0;
  this->nAlloc = 0;
  this->nStored = 0;
  reserve(this,other->nStored);
  sVar1 = other->nStored;
  if (sVar1 != 0) {
    paVar2 = &this->field_2;
    if ((anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
         *)this->ptr !=
        (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
         *)0x0) {
      paVar2 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                *)this->ptr;
    }
    paVar4 = &other->field_2;
    if ((anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
         *)other->ptr !=
        (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
         *)0x0) {
      paVar4 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                *)other->ptr;
    }
    sVar3 = 0;
    do {
      paVar2->fixed[sVar3] = paVar4->fixed[sVar3];
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
  }
  this->nStored = sVar1;
  return;
}

Assistant:

InlinedVector(const InlinedVector &other, const Allocator &alloc = {})
        : alloc(alloc) {
        reserve(other.size());
        for (size_t i = 0; i < other.size(); ++i)
            this->alloc.template construct<T>(begin() + i, other[i]);
        nStored = other.size();
    }